

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

int smooth_filter_noise(FIRSTPASS_STATS *first_stats,FIRSTPASS_STATS *last_stats)

{
  int iVar1;
  void *pvVar2;
  long in_RSI;
  long in_RDI;
  int i_1;
  int idx;
  int j;
  double total_wt;
  double total_noise;
  int i;
  double *smooth_noise;
  int len;
  undefined4 local_58;
  undefined4 local_54;
  int in_stack_ffffffffffffffb0;
  int iVar3;
  undefined4 local_44;
  undefined8 local_40;
  undefined8 local_38;
  undefined4 local_2c;
  undefined4 local_4;
  
  iVar1 = (int)((in_RSI - in_RDI) / 0xe8);
  pvVar2 = aom_malloc(0x5c8767);
  if (pvVar2 == (void *)0x0) {
    local_4 = -1;
  }
  else {
    for (local_2c = 0; local_2c < iVar1; local_2c = local_2c + 1) {
      local_38 = 0.0;
      local_40 = 0.0;
      for (local_44 = -3; local_44 < 4; local_44 = local_44 + 1) {
        if (local_2c + local_44 < 1) {
          in_stack_ffffffffffffffb0 = 0;
        }
        else {
          in_stack_ffffffffffffffb0 = local_2c + local_44;
        }
        if (in_stack_ffffffffffffffb0 < iVar1 + -1) {
          if (local_2c + local_44 < 1) {
            local_54 = 0;
          }
          else {
            local_54 = local_2c + local_44;
          }
          local_58 = local_54;
        }
        else {
          local_58 = iVar1 + -1;
        }
        if (*(long *)(in_RDI + (long)local_58 * 0xe8 + 0xc0) == 0) {
          local_38 = *(double *)(in_RDI + (long)local_58 * 0xe8 + 200) + local_38;
          local_40 = local_40 + 1.0;
        }
      }
      if (local_40 <= 0.01) {
        local_38 = *(double *)(in_RDI + (long)local_2c * 0xe8 + 200);
      }
      else {
        local_38 = local_38 / local_40;
      }
      *(double *)((long)pvVar2 + (long)local_2c * 8) = local_38;
    }
    for (iVar3 = 0; iVar3 < iVar1; iVar3 = iVar3 + 1) {
      *(undefined8 *)(in_RDI + (long)iVar3 * 0xe8 + 200) =
           *(undefined8 *)((long)pvVar2 + (long)iVar3 * 8);
    }
    aom_free((void *)CONCAT44(iVar3,in_stack_ffffffffffffffb0));
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int smooth_filter_noise(FIRSTPASS_STATS *first_stats,
                               FIRSTPASS_STATS *last_stats) {
  int len = (int)(last_stats - first_stats);
  double *smooth_noise = aom_malloc(len * sizeof(*smooth_noise));
  if (!smooth_noise) return -1;

  for (int i = 0; i < len; i++) {
    double total_noise = 0;
    double total_wt = 0;
    for (int j = -HALF_FILT_LEN; j <= HALF_FILT_LEN; j++) {
      int idx = AOMMIN(AOMMAX(i + j, 0), len - 1);
      if (first_stats[idx].is_flash) continue;

      total_noise += first_stats[idx].noise_var;
      total_wt += 1.0;
    }
    if (total_wt > 0.01) {
      total_noise /= total_wt;
    } else {
      total_noise = first_stats[i].noise_var;
    }
    smooth_noise[i] = total_noise;
  }

  for (int i = 0; i < len; i++) {
    first_stats[i].noise_var = smooth_noise[i];
  }

  aom_free(smooth_noise);
  return 0;
}